

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O3

GetOpt_pp * __thiscall
GetOpt::GetOpt_pp::operator>>(GetOpt_pp *this,_func_ios_base_ptr_ios_base_ptr *iomanip)

{
  stringstream ss;
  long local_1a0 [2];
  long local_190;
  fmtflags afStack_188 [4];
  fmtflags afStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  *(fmtflags *)((long)afStack_188 + *(long *)(local_1a0[0] + -0x18)) = this->_flags;
  (*iomanip)((ios_base *)((long)afStack_188 + *(long *)(local_190 + -0x18) + -8));
  this->_flags = *(fmtflags *)((long)afStack_178 + *(long *)(local_190 + -0x18));
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return this;
}

Assistant:

GETOPT_INLINE GetOpt_pp& GetOpt_pp::operator >> (std::ios_base & (*iomanip)(std::ios_base&))
{
    std::stringstream ss;
    ss.flags(_flags);
    _flags = (ss << iomanip).flags();
    return *this;
}